

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Operate * __thiscall Parser::parseOperator(Parser *this)

{
  FILE *__stream;
  string *__str;
  Operate *this_00;
  TokenType type;
  string temp;
  string local_38;
  
  __str = Token::getValue_abi_cxx11_(this->currentToken);
  std::__cxx11::string::string((string *)&temp,__str);
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_38,(Token *)0x1,type);
  fprintf(__stream,"\x1b[32m\tParsing [%s] \'%s\'\n\x1b[0m",local_38._M_dataplus._M_p,
          temp._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  loadNextToken(this);
  this_00 = (Operate *)operator_new(0x28);
  Operate::Operate(this_00,&temp);
  std::__cxx11::string::~string((string *)&temp);
  return this_00;
}

Assistant:

Operate *Parser::parseOperator() {
    // Store temp value
    std::string temp = currentToken->getValue();

    // Debug output
    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [%s] \'%s\'\n" ANSI_COLOR_RESET,
                Token::tokenDesc(TokenType::OperaterToken).data(), temp.data());
    }

    // Prep next token
    loadNextToken();

    return new Operate(temp);
}